

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

uint64_t a15_l2ctlr_read_arm(CPUARMState *env,ARMCPRegInfo *ri)

{
  ARMCPRegInfo *ri_local;
  CPUARMState *env_local;
  
  return 0x800000;
}

Assistant:

uint64_t a15_l2ctlr_read(CPUARMState *env, const ARMCPRegInfo *ri)
{
#if 0
    MachineState *ms = MACHINE(qdev_get_machine());

    /* Linux wants the number of processors from here.
     * Might as well set the interrupt-controller bit too.
     */
    return ((ms->smp.cpus - 1) << 24) | (1 << 23);
#endif
    return (1 << 23);
}